

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void YUY2ToUV422Row_C(uint8_t *src_yuy2,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  int x;
  int width_local;
  uint8_t *dst_v_local;
  uint8_t *dst_u_local;
  uint8_t *src_yuy2_local;
  
  dst_v_local = dst_v;
  dst_u_local = dst_u;
  src_yuy2_local = src_yuy2;
  for (x = 0; x < width; x = x + 2) {
    *dst_u_local = src_yuy2_local[1];
    *dst_v_local = src_yuy2_local[3];
    src_yuy2_local = src_yuy2_local + 4;
    dst_u_local = dst_u_local + 1;
    dst_v_local = dst_v_local + 1;
  }
  return;
}

Assistant:

void YUY2ToUV422Row_C(const uint8_t* src_yuy2,
                      uint8_t* dst_u,
                      uint8_t* dst_v,
                      int width) {
  // Output a row of UV values.
  int x;
  for (x = 0; x < width; x += 2) {
    dst_u[0] = src_yuy2[1];
    dst_v[0] = src_yuy2[3];
    src_yuy2 += 4;
    dst_u += 1;
    dst_v += 1;
  }
}